

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cProgramInterfaceQueryTests.cpp
# Opt level: O0

long __thiscall
gl4cts::anon_unknown_0::SeparateProgramsTessEval::Run(SeparateProgramsTessEval *this)

{
  uint uVar1;
  char *pcVar2;
  uint program;
  mapped_type *pmVar3;
  allocator<char> local_289;
  key_type local_288;
  undefined8 uStack_268;
  GLint expected3 [11];
  GLenum props3 [11];
  undefined8 uStack_1e8;
  GLint expected2 [10];
  undefined8 uStack_1b8;
  GLenum props2 [10];
  allocator<char> local_181;
  string local_180 [39];
  allocator<char> local_159;
  key_type local_158;
  allocator<char> local_131;
  string local_130 [39];
  allocator<char> local_109;
  key_type local_108;
  allocator<char> local_e1;
  string local_e0 [55];
  allocator<char> local_a9;
  string local_a8 [32];
  undefined1 local_88 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  indicesO;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  indicesI;
  char *pcStack_20;
  GLuint tcs;
  char *srcTCS;
  long error;
  SeparateProgramsTessEval *this_local;
  
  srcTCS = (char *)0x0;
  pcStack_20 = 
  "#version 430                                                  \nlayout(quads, equal_spacing, ccw) in;                         \nout gl_PerVertex {                                            \n   vec4 gl_Position;                                          \n   float gl_PointSize;                                        \n   float gl_ClipDistance[];                                   \n};                                                            \nin gl_PerVertex {                   \n   vec4 gl_Position;                \n   float gl_PointSize;              \n   float gl_ClipDistance[];         \n} gl_in[];                          \nvoid main() {                                \n   vec4 p0 = gl_in[0].gl_Position;           \n   vec4 p1 = gl_in[1].gl_Position;           \n   vec4 p2 = gl_in[2].gl_Position;           \n   gl_Position = vec4(p0.x, p1.y, p2.z, p0.x);                 \n}"
  ;
  error = (long)this;
  program = (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.
              super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x18])
                      (this,0x8e87,1,&stack0xffffffffffffffe0);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
         *)&indicesO._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
         *)local_88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a8,"gl_PerVertex.gl_Position",&local_a9);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xf])
            (this,(ulong)program,0x92e3,&indicesO._M_t._M_impl.super__Rb_tree_header._M_node_count,
             local_a8,&srcTCS);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator(&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_e0,"gl_Position",&local_e1);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xf])(this,(ulong)program,0x92e4,local_88,local_e0,&srcTCS);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator(&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"gl_PerVertex.gl_Position",&local_109);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)&indicesO._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_108);
  uVar1 = *pmVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_130,"gl_PerVertex.gl_Position",&local_131);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x10])
            (this,(ulong)program,0x92e3,(ulong)uVar1,local_130,&srcTCS);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator(&local_131);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"gl_Position",&local_159);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_88,&local_158);
  uVar1 = *pmVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_180,"gl_Position",&local_181);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x10])
            (this,(ulong)program,0x92e4,(ulong)uVar1,local_180,&srcTCS);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator(&local_181);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  props2[6] = 0x9306;
  props2[7] = 0x92e7;
  props2[2] = 0x930a;
  props2[3] = 0x9309;
  props2[4] = 0x9307;
  props2[5] = 0x9308;
  uStack_1b8 = 0x92fa000092f9;
  props2[0] = 0x92fb;
  props2[1] = 0x930b;
  expected2[2] = 0;
  expected2[3] = 0;
  expected2[6] = 0;
  expected2[7] = 0;
  uStack_1e8 = 0x8b5200000019;
  expected2[0] = 1;
  expected2[1] = 0;
  expected2[4] = 0;
  expected2[5] = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(props3 + 10),"gl_PerVertex.gl_Position",
             (allocator<char> *)((long)props3 + 0x27));
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)&indicesO._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        (key_type *)(props3 + 10));
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x13])
            (this,(ulong)program,0x92e3,(ulong)*pmVar3,10,&uStack_1b8,10,&uStack_1e8,&srcTCS);
  std::__cxx11::string::~string((string *)(props3 + 10));
  std::allocator<char>::~allocator((allocator<char> *)((long)props3 + 0x27));
  props3[6] = 0x9306;
  props3[7] = 0x92e7;
  props3[8] = 0x930f;
  props3[2] = 0x930a;
  props3[3] = 0x9309;
  props3[4] = 0x9307;
  props3[5] = 0x9308;
  stack0xfffffffffffffdc8 = 0x92fa000092f9;
  props3[0] = 0x92fb;
  props3[1] = 0x930b;
  expected3[6] = 0;
  expected3[2] = 0;
  expected3[3] = 0;
  expected3[4] = 0;
  uStack_268 = 0x8b520000000c;
  expected3[0] = 1;
  expected3[1] = 0;
  expected3[5] = 1;
  expected3[7] = 0;
  expected3[8] = -1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_288,"gl_Position",&local_289);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_88,&local_288);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x13])
            (this,(ulong)program,0x92e4,(ulong)*pmVar3,0xb,expected3 + 10,0xb,&uStack_268,&srcTCS);
  std::__cxx11::string::~string((string *)&local_288);
  std::allocator<char>::~allocator(&local_289);
  glu::CallLogWrapper::glDeleteProgram
            (&(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.
              super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,program);
  pcVar2 = srcTCS;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          *)local_88);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          *)&indicesO._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return (long)pcVar2;
}

Assistant:

virtual long Run()
	{
		long error = NO_ERROR;

		const char* srcTCS = "#version 430                                                  \n"
							 "layout(quads, equal_spacing, ccw) in;                         \n"
							 "out gl_PerVertex {                                            \n"
							 "   vec4 gl_Position;                                          \n"
							 "   float gl_PointSize;                                        \n"
							 "   float gl_ClipDistance[];                                   \n"
							 "};                                                            \n"
							 ""
							 "in gl_PerVertex {                   \n"
							 "   vec4 gl_Position;                \n"
							 "   float gl_PointSize;              \n"
							 "   float gl_ClipDistance[];         \n"
							 "} gl_in[];                          \n"
							 ""
							 "void main() {                                \n"
							 "   vec4 p0 = gl_in[0].gl_Position;           \n"
							 "   vec4 p1 = gl_in[1].gl_Position;           \n"
							 "   vec4 p2 = gl_in[2].gl_Position;           \n"
							 "   gl_Position = vec4(p0.x, p1.y, p2.z, p0.x);                 \n"
							 "}";

		const GLuint tcs = CreateShaderProgram(GL_TESS_EVALUATION_SHADER, 1, &srcTCS);

		std::map<std::string, GLuint> indicesI;
		std::map<std::string, GLuint> indicesO;
		VerifyGetProgramResourceIndex(tcs, GL_PROGRAM_INPUT, indicesI, "gl_PerVertex.gl_Position", error);
		VerifyGetProgramResourceIndex(tcs, GL_PROGRAM_OUTPUT, indicesO, "gl_Position", error);

		VerifyGetProgramResourceName(tcs, GL_PROGRAM_INPUT, indicesI["gl_PerVertex.gl_Position"],
									 "gl_PerVertex.gl_Position", error);
		VerifyGetProgramResourceName(tcs, GL_PROGRAM_OUTPUT, indicesO["gl_Position"], "gl_Position", error);

		GLenum props2[] = { GL_NAME_LENGTH,
							GL_TYPE,
							GL_ARRAY_SIZE,
							GL_REFERENCED_BY_COMPUTE_SHADER,
							GL_REFERENCED_BY_FRAGMENT_SHADER,
							GL_REFERENCED_BY_GEOMETRY_SHADER,
							GL_REFERENCED_BY_TESS_CONTROL_SHADER,
							GL_REFERENCED_BY_TESS_EVALUATION_SHADER,
							GL_REFERENCED_BY_VERTEX_SHADER,
							GL_IS_PER_PATCH };
		GLint expected2[] = { 25, GL_FLOAT_VEC4, 1, 0, 0, 0, 0, 1, 0, 0 };
		VerifyGetProgramResourceiv(tcs, GL_PROGRAM_INPUT, indicesI["gl_PerVertex.gl_Position"], 10, props2, 10,
								   expected2, error);

		GLenum props3[] = { GL_NAME_LENGTH,
							GL_TYPE,
							GL_ARRAY_SIZE,
							GL_REFERENCED_BY_COMPUTE_SHADER,
							GL_REFERENCED_BY_FRAGMENT_SHADER,
							GL_REFERENCED_BY_GEOMETRY_SHADER,
							GL_REFERENCED_BY_TESS_CONTROL_SHADER,
							GL_REFERENCED_BY_TESS_EVALUATION_SHADER,
							GL_REFERENCED_BY_VERTEX_SHADER,
							GL_IS_PER_PATCH,
							GL_LOCATION_INDEX };
		GLint expected3[] = { 12, GL_FLOAT_VEC4, 1, 0, 0, 0, 0, 1, 0, 0, -1 };
		VerifyGetProgramResourceiv(tcs, GL_PROGRAM_OUTPUT, indicesO["gl_Position"], 11, props3, 11, expected3, error);

		glDeleteProgram(tcs);
		return error;
	}